

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void ScalePlane_16(uint16_t *src,int src_stride,int src_width,int src_height,uint16_t *dst,
                  int dst_stride,int dst_width,int dst_height,FilterMode filtering)

{
  FilterMode filtering_00;
  int iVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  uint16_t *puVar5;
  long lVar6;
  long lVar7;
  uint32_t *dst_ptr;
  uint16_t *src_ptr;
  code *pcVar8;
  int iVar9;
  bool bVar10;
  int local_c0;
  code *local_b8;
  uint16_t *local_a0;
  int y;
  uint16_t *local_88;
  code *local_80;
  int local_74;
  int dx;
  int x;
  void *local_68;
  long local_60;
  code *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = dst;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  puVar5 = local_88;
  local_a0 = src;
  local_c0 = src_stride;
  if (src_height < 0) {
    local_a0 = src + ~src_height * src_stride;
    local_c0 = -src_stride;
    src_height = -src_height;
  }
  if (src_height == dst_height && dst_width == src_width) {
    CopyPlane_16(local_a0,local_c0,local_88,dst_stride,dst_width,dst_height);
    return;
  }
  if (filtering_00 != kFilterBox && dst_width == src_width) {
    iVar1 = FixedDiv_X86(src_height,dst_height);
    ScalePlaneVertical_16
              (src_height,dst_width,dst_height,local_c0,dst_stride,local_a0,local_88,0,0,iVar1,1,
               filtering_00);
    return;
  }
  iVar1 = -src_width;
  if (0 < src_width) {
    iVar1 = src_width;
  }
  if (dst_height <= src_height && dst_width <= iVar1) {
    if ((dst_width * 4 == src_width * 3) && (dst_height * 4 == src_height * 3)) {
      iVar3 = 0;
      iVar1 = local_c0;
      if (filtering_00 == kFilterLinear) {
        iVar1 = 0;
      }
      if (filtering_00 == kFilterNone) {
        local_80 = ScaleRowDown34_16_C;
        local_b8 = ScaleRowDown34_16_C;
      }
      else {
        local_b8 = ScaleRowDown34_0_Box_16_C;
        local_80 = ScaleRowDown34_1_Box_16_C;
      }
      local_88 = (uint16_t *)CONCAT44(local_88._4_4_,dst_height + -2);
      lVar7 = (long)iVar1;
      local_38 = (long)local_c0;
      lVar6 = (long)dst_stride;
      local_58 = (code *)(lVar6 * 2);
      local_60 = lVar6 * 4;
      local_68 = (void *)((long)(local_c0 * 2) * 2 + local_38 * 4);
      local_48 = local_38 * 2;
      local_50 = local_38 * 6;
      local_40 = lVar6;
      for (; iVar3 < (int)local_88; iVar3 = iVar3 + 3) {
        (*local_b8)(local_a0,lVar7,puVar5,dst_width);
        (*local_80)((long)local_a0 + local_48,lVar7,(long)puVar5 + (long)local_58,dst_width);
        (*local_b8)((long)local_a0 + local_50,(long)-iVar1,(long)puVar5 + local_60,dst_width);
        puVar5 = puVar5 + lVar6 * 3;
        local_a0 = (uint16_t *)((long)local_a0 + (long)local_68);
      }
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*local_b8)(local_a0,lVar7,puVar5,dst_width);
        local_a0 = local_a0 + local_38;
        puVar5 = puVar5 + local_40;
        local_b8 = local_80;
      }
LAB_0014df10:
      (*local_b8)(local_a0,0,puVar5,dst_width);
      return;
    }
    if (dst_height * 2 == src_height && dst_width * 2 == src_width) {
      if (filtering_00 == kFilterLinear) {
        local_b8 = ScaleRowDown2Linear_16_C;
      }
      else {
        local_b8 = ScaleRowDown2Box_16_C;
      }
      iVar1 = local_c0 * 2;
      iVar3 = 0;
      if (filtering_00 == kFilterNone) {
        local_b8 = ScaleRowDown2_16_C;
        iVar3 = local_c0;
      }
      local_a0 = local_a0 + iVar3;
      if (filtering_00 < kFilterBilinear) {
        local_c0 = 0;
      }
      iVar3 = 0;
      if (0 < dst_height) {
        iVar3 = dst_height;
      }
      while (iVar3 != 0) {
        (*local_b8)(local_a0,(long)local_c0,puVar5,dst_width);
        local_a0 = local_a0 + iVar1;
        puVar5 = puVar5 + dst_stride;
        iVar3 = iVar3 + -1;
      }
      return;
    }
    if ((dst_width * 8 == src_width * 3) && (dst_height * 8 == src_height * 3)) {
      iVar3 = 0;
      iVar1 = local_c0;
      if (filtering_00 == kFilterLinear) {
        iVar1 = 0;
      }
      if (filtering_00 == kFilterNone) {
        local_80 = ScaleRowDown38_16_C;
        local_b8 = ScaleRowDown38_16_C;
      }
      else {
        local_b8 = ScaleRowDown38_3_Box_16_C;
        local_80 = ScaleRowDown38_2_Box_16_C;
      }
      local_88 = (uint16_t *)CONCAT44(local_88._4_4_,dst_height + -2);
      lVar7 = (long)iVar1;
      local_48 = (long)(local_c0 * 3);
      lVar6 = (long)dst_stride;
      local_58 = (code *)(local_48 * 4);
      local_60 = (long)(local_c0 * 2) * 2 + local_48 * 4;
      local_68 = (void *)(local_48 * 2);
      local_50 = lVar6;
      for (; iVar3 < (int)local_88; iVar3 = iVar3 + 3) {
        (*local_b8)(local_a0,lVar7,puVar5,dst_width);
        (*local_b8)((long)local_a0 + (long)local_68,lVar7,puVar5 + lVar6,dst_width);
        (*local_80)((long)local_a0 + (long)local_58,lVar7,puVar5 + lVar6 * 2,dst_width);
        puVar5 = puVar5 + lVar6 * 3;
        local_a0 = (uint16_t *)((long)local_a0 + local_60);
      }
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*local_b8)(local_a0,lVar7,puVar5,dst_width);
        local_a0 = local_a0 + local_48;
        puVar5 = puVar5 + local_50;
      }
      goto LAB_0014df10;
    }
    if (dst_height * 4 == src_height && dst_width * 4 == src_width) {
      if ((filtering_00 == kFilterBox) || (filtering_00 == kFilterNone)) {
        iVar1 = local_c0 * 4;
        if (filtering_00 == kFilterNone) {
          iVar3 = local_c0 * 2;
          local_b8 = ScaleRowDown4_16_C;
        }
        else {
          local_b8 = ScaleRowDown4Box_16_C;
          iVar3 = 0;
        }
        local_a0 = local_a0 + iVar3;
        if (filtering_00 < kFilterBilinear) {
          local_c0 = 0;
        }
        iVar3 = 0;
        if (0 < dst_height) {
          iVar3 = dst_height;
        }
        while (iVar3 != 0) {
          (*local_b8)(local_a0,(long)local_c0,puVar5,dst_width);
          local_a0 = local_a0 + iVar1;
          puVar5 = puVar5 + dst_stride;
          iVar3 = iVar3 + -1;
        }
        return;
      }
      goto LAB_0014da1a;
    }
  }
  if (dst_height * 2 < src_height && filtering_00 == kFilterBox) {
    x = 0;
    y = 0;
    dx = 0;
    local_74 = 0;
    ScaleSlope(src_width,src_height,dst_width,dst_height,kFilterBox,&x,&y,&dx,&local_74);
    local_80 = (code *)(ulong)(uint)(iVar1 * 4);
    local_68 = malloc((ulong)(iVar1 * 4 + 0x3f));
    dst_ptr = (uint32_t *)((long)local_68 + 0x3fU & 0xffffffffffffffc0);
    local_58 = libyuv::ScaleAddCols2_16_C;
    if ((short)dx == 0) {
      local_58 = libyuv::ScaleAddCols1_16_C;
    }
    local_60 = (long)dst_stride;
    iVar3 = 0;
    if (dst_height < 1) {
      dst_height = 0;
    }
    for (; iVar3 != dst_height; iVar3 = iVar3 + 1) {
      iVar2 = y >> 0x10;
      src_ptr = local_a0 + iVar2 * local_c0;
      y = y + local_74;
      if (src_height << 0x10 <= y) {
        y = src_height << 0x10;
      }
      iVar2 = (y >> 0x10) - iVar2;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      local_88 = puVar5;
      memset(dst_ptr,0,(size_t)local_80);
      iVar9 = iVar2;
      while (puVar5 = local_88, bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        ScaleAddRow_16_C(src_ptr,dst_ptr,iVar1);
        src_ptr = src_ptr + local_c0;
      }
      (*local_58)(dst_width,iVar2,x,dx,dst_ptr,local_88);
      puVar5 = puVar5 + local_60;
    }
    free(local_68);
    return;
  }
LAB_0014da1a:
  if (filtering_00 == kFilterNone || dst_height <= src_height) {
    if (filtering_00 == kFilterNone) {
      x = 0;
      y = 0;
      dx = 0;
      local_74 = 0;
      ScaleSlope(src_width,src_height,dst_width,dst_height,kFilterNone,&x,&y,&dx,&local_74);
      pcVar4 = ScaleCols_16_C;
      if (x < 0x8000) {
        pcVar4 = ScaleColsUp2_16_C;
      }
      pcVar8 = ScaleCols_16_C;
      if (iVar1 * 2 == dst_width) {
        pcVar8 = pcVar4;
      }
      iVar1 = 0;
      if (0 < dst_height) {
        iVar1 = dst_height;
      }
      while (iVar1 != 0) {
        (*pcVar8)(puVar5,local_a0 + y._2_2_ * local_c0,dst_width,x,dx);
        y = y + local_74;
        puVar5 = puVar5 + dst_stride;
        iVar1 = iVar1 + -1;
      }
    }
    else {
      ScalePlaneBilinearDown_16
                (src_width,src_height,dst_width,dst_height,local_c0,dst_stride,local_a0,local_88,
                 filtering_00);
    }
  }
  else {
    ScalePlaneBilinearUp_16
              (src_width,src_height,dst_width,dst_height,local_c0,dst_stride,local_a0,local_88,
               filtering_00);
  }
  return;
}

Assistant:

LIBYUV_API
void ScalePlane_16(const uint16_t* src,
                   int src_stride,
                   int src_width,
                   int src_height,
                   uint16_t* dst,
                   int dst_stride,
                   int dst_width,
                   int dst_height,
                   enum FilterMode filtering) {
  // Simplify filtering when possible.
  filtering = ScaleFilterReduce(src_width, src_height, dst_width, dst_height,
                                filtering);

  // Negative height means invert the image.
  if (src_height < 0) {
    src_height = -src_height;
    src = src + (src_height - 1) * src_stride;
    src_stride = -src_stride;
  }

  // Use specialized scales to improve performance for common resolutions.
  // For example, all the 1/2 scalings will use ScalePlaneDown2()
  if (dst_width == src_width && dst_height == src_height) {
    // Straight copy.
    CopyPlane_16(src, src_stride, dst, dst_stride, dst_width, dst_height);
    return;
  }
  if (dst_width == src_width && filtering != kFilterBox) {
    int dy = FixedDiv(src_height, dst_height);
    // Arbitrary scale vertically, but unscaled horizontally.
    ScalePlaneVertical_16(src_height, dst_width, dst_height, src_stride,
                          dst_stride, src, dst, 0, 0, dy, 1, filtering);
    return;
  }
  if (dst_width <= Abs(src_width) && dst_height <= src_height) {
    // Scale down.
    if (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) {
      // optimized, 3/4
      ScalePlaneDown34_16(src_width, src_height, dst_width, dst_height,
                          src_stride, dst_stride, src, dst, filtering);
      return;
    }
    if (2 * dst_width == src_width && 2 * dst_height == src_height) {
      // optimized, 1/2
      ScalePlaneDown2_16(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
      return;
    }
    // 3/8 rounded up for odd sized chroma height.
    if (8 * dst_width == 3 * src_width && 8 * dst_height == 3 * src_height) {
      // optimized, 3/8
      ScalePlaneDown38_16(src_width, src_height, dst_width, dst_height,
                          src_stride, dst_stride, src, dst, filtering);
      return;
    }
    if (4 * dst_width == src_width && 4 * dst_height == src_height &&
        (filtering == kFilterBox || filtering == kFilterNone)) {
      // optimized, 1/4
      ScalePlaneDown4_16(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
      return;
    }
  }
  if (filtering == kFilterBox && dst_height * 2 < src_height) {
    ScalePlaneBox_16(src_width, src_height, dst_width, dst_height, src_stride,
                     dst_stride, src, dst);
    return;
  }
  if (filtering && dst_height > src_height) {
    ScalePlaneBilinearUp_16(src_width, src_height, dst_width, dst_height,
                            src_stride, dst_stride, src, dst, filtering);
    return;
  }
  if (filtering) {
    ScalePlaneBilinearDown_16(src_width, src_height, dst_width, dst_height,
                              src_stride, dst_stride, src, dst, filtering);
    return;
  }
  ScalePlaneSimple_16(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst);
}